

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIService.h
# Opt level: O3

optional<libchess::UCIGoParameters> *
libchess::UCIService::parse_go_line
          (optional<libchess::UCIGoParameters> *__return_storage_ptr__,istringstream *line_stream)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  int iVar11;
  istream *piVar12;
  long *plVar13;
  long lVar14;
  ulong *puVar15;
  optional<libchess::UCIGoParameters> *poVar16;
  bool bVar17;
  byte bVar18;
  int movestogo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchmoves;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  searchmoves_opt;
  string tmp;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  ulong local_138;
  ulong local_120;
  undefined1 local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  undefined2 local_d8;
  _Storage<libchess::UCIMoveList,_false> local_d0;
  byte local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  char local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  byte local_58;
  value_type local_50;
  
  bVar18 = 0;
  local_58 = 0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  uVar8 = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  uVar7 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  uVar2 = 0;
  uVar1 = 0;
  uVar9 = 0;
  uVar10 = 0;
LAB_0012cba8:
  do {
    bVar17 = false;
LAB_0012cbab:
    piVar12 = std::operator>>((istream *)line_stream,(string *)&local_50);
    if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
LAB_0012cf2a:
      if (local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_78 = 0;
      }
      else {
        std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
        operator=((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)&local_70,&local_a8);
        local_78 = 0;
        if ((local_58 & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_90,&local_70);
          local_78 = '\x01';
          bVar17 = true;
          goto LAB_0012cfa0;
        }
      }
      local_78 = '\0';
      bVar17 = false;
LAB_0012cfa0:
      local_120 = local_138;
      local_118 = uVar1;
      local_110 = (ulong)CONCAT14(uVar2,local_14c);
      local_108 = (ulong)CONCAT14(uVar3,local_150);
      local_100 = (ulong)CONCAT14(uVar4,local_154);
      local_f8 = (ulong)CONCAT14(uVar5,local_158);
      local_f0 = (ulong)CONCAT14(uVar6,local_15c);
      local_e8 = (ulong)CONCAT14(uVar7,local_160);
      local_e0 = (ulong)CONCAT14(uVar8,local_164);
      local_d8 = CONCAT11(uVar10,uVar9);
      local_b8 = 0;
      if (bVar17) {
        std::optional<libchess::UCIMoveList>::
        emplace<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((optional<libchess::UCIMoveList> *)&local_d0._M_value,&local_90);
        puVar15 = &local_120;
        poVar16 = __return_storage_ptr__;
        for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(ulong *)&(poVar16->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
                     _M_payload.
                     super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                     super__Optional_payload_base<libchess::UCIGoParameters>._M_payload._M_value.
                     nodes_.super__Optional_base<unsigned_long,_true,_true> = *puVar15;
          puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
          poVar16 = (optional<libchess::UCIGoParameters> *)
                    ((long)poVar16 + (ulong)bVar18 * -0x10 + 8);
        }
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                 super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                 super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x48) =
             local_d8;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                 super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                 super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x68) = 0;
        if ((local_b8 & 1) != 0) {
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                   super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                   super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x50) =
               local_d0._M_value.move_list_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                   super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                   super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x58) =
               local_d0._M_value.move_list_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                   super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                   super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x60) =
               local_d0._M_value.move_list_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_d0._M_value.move_list_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d0._M_value.move_list_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d0._M_value.move_list_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                   super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                   super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x68) = 1;
          local_b8 = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_d0._M_value.move_list_);
        }
      }
      else {
        puVar15 = &local_120;
        poVar16 = __return_storage_ptr__;
        for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(ulong *)&(poVar16->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
                     _M_payload.
                     super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                     super__Optional_payload_base<libchess::UCIGoParameters>._M_payload._M_value.
                     nodes_.super__Optional_base<unsigned_long,_true,_true> = *puVar15;
          puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
          poVar16 = (optional<libchess::UCIGoParameters> *)
                    ((long)poVar16 + (ulong)bVar18 * -0x10 + 8);
        }
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                 super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                 super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x48) =
             local_d8;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                 super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                 super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x68) = 0;
      }
      (__return_storage_ptr__->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
      _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
      super__Optional_payload_base<libchess::UCIGoParameters>._M_engaged = true;
      if (local_78 == '\x01') {
        local_78 = '\0';
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      if (local_58 == 1) {
        local_58 = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_70);
      }
      return __return_storage_ptr__;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = 0;
      piVar12 = std::istream::_M_extract<unsigned_long>((ulong *)line_stream);
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
        uVar1 = 1;
        local_138 = local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = local_120 & 0xffffffff00000000;
      plVar13 = (long *)std::istream::operator>>((istream *)line_stream,(int *)&local_120);
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) {
        uVar2 = 1;
        local_14c = (undefined4)local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = local_120 & 0xffffffff00000000;
      plVar13 = (long *)std::istream::operator>>((istream *)line_stream,(int *)&local_120);
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) {
        uVar3 = 1;
        local_150 = (undefined4)local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = local_120 & 0xffffffff00000000;
      plVar13 = (long *)std::istream::operator>>((istream *)line_stream,(int *)&local_120);
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) {
        uVar4 = 1;
        local_154 = (undefined4)local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = local_120 & 0xffffffff00000000;
      plVar13 = (long *)std::istream::operator>>((istream *)line_stream,(int *)&local_120);
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) {
        uVar5 = 1;
        local_158 = (undefined4)local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = local_120 & 0xffffffff00000000;
      plVar13 = (long *)std::istream::operator>>((istream *)line_stream,(int *)&local_120);
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) {
        uVar6 = 1;
        local_15c = (undefined4)local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = local_120 & 0xffffffff00000000;
      plVar13 = (long *)std::istream::operator>>((istream *)line_stream,(int *)&local_120);
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) {
        uVar7 = 1;
        local_160 = (undefined4)local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      local_120 = local_120 & 0xffffffff00000000;
      plVar13 = (long *)std::istream::operator>>((istream *)line_stream,(int *)&local_120);
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) {
        uVar8 = 1;
        local_164 = (undefined4)local_120;
      }
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 == 0) {
      uVar9 = 1;
      goto LAB_0012cba8;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar11 != 0) {
      iVar11 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar11 == 0) {
        bVar17 = true;
      }
      else {
        if (!bVar17) goto LAB_0012cf2a;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_a8,&local_50);
      }
      goto LAB_0012cbab;
    }
    uVar10 = 1;
  } while( true );
}

Assistant:

static std::optional<UCIGoParameters> parse_go_line(std::istringstream& line_stream) noexcept {
        std::optional<std::uint64_t> nodes_opt;
        std::optional<int> movetime_opt;
        std::optional<int> depth_opt;
        std::optional<int> wtime_opt;
        std::optional<int> winc_opt;
        std::optional<int> btime_opt;
        std::optional<int> binc_opt;
        std::optional<int> movestogo_opt;
        bool infinite = false;
        bool ponder = false;
        std::optional<std::vector<std::string>> searchmoves_opt;

        std::vector<std::string> searchmoves;
        bool filling_searchmoves = false;
        std::string tmp;
        while (line_stream >> tmp) {
            if (tmp == "nodes") {
                std::uint64_t nodes = 0;
                if (line_stream >> nodes) {
                    nodes_opt = nodes;
                }
            } else if (tmp == "movetime") {
                int movetime = 0;
                if (line_stream >> movetime) {
                    movetime_opt = movetime;
                }
            } else if (tmp == "depth") {
                int depth = 0;
                if (line_stream >> depth) {
                    depth_opt = depth;
                }
            } else if (tmp == "wtime") {
                int wtime = 0;
                if (line_stream >> wtime) {
                    wtime_opt = wtime;
                }
            } else if (tmp == "winc") {
                int winc = 0;
                if (line_stream >> winc) {
                    winc_opt = winc;
                }
            } else if (tmp == "btime") {
                int btime = 0;
                if (line_stream >> btime) {
                    btime_opt = btime;
                }
            } else if (tmp == "binc") {
                int binc = 0;
                if (line_stream >> binc) {
                    binc_opt = binc;
                }
            } else if (tmp == "movestogo") {
                int movestogo = 0;
                if (line_stream >> movestogo) {
                    movestogo_opt = movestogo;
                }
            } else if (tmp == "infinite") {
                infinite = true;
            } else if (tmp == "ponder") {
                ponder = true;
            } else if (tmp == "searchmoves") {
                filling_searchmoves = true;
                continue;
            } else if (filling_searchmoves) {
                searchmoves.push_back(tmp);
                continue;
            } else {
                break;
            }
            filling_searchmoves = false;
        }
        if (!searchmoves.empty()) {
            searchmoves_opt = searchmoves;
        }

        return UCIGoParameters{nodes_opt,
                               movetime_opt,
                               depth_opt,
                               wtime_opt,
                               winc_opt,
                               btime_opt,
                               binc_opt,
                               movestogo_opt,
                               infinite,
                               ponder,
                               searchmoves_opt};
    }